

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O0

_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
 XPMP2::
 iterRnd<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
           (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
            lower,_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
                  upper)

{
  int iVar1;
  difference_type dVar2;
  _Base_ptr in_RSI;
  _Base_ptr in_RDI;
  long adv;
  float rnd;
  long dist;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
  in_stack_ffffffffffffffa8;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
  in_stack_ffffffffffffffb8;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
  in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  _Base_ptr __i;
  _Base_ptr local_10;
  _Base_ptr local_8;
  
  __i = in_RSI;
  dVar2 = std::
          distance<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_8 = in_RSI;
  if ((0 < dVar2) && (local_8 = in_RDI, dVar2 != 1)) {
    iVar1 = rand();
    if ((long)(((float)iVar1 / 2.1474836e+09) * (float)dVar2) < dVar2) {
      std::
      advance<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>,long>
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
                  *)__i,CONCAT44((float)iVar1 / 2.1474836e+09,in_stack_ffffffffffffffc8));
      local_10 = in_RDI;
    }
    else {
      local_10 = (_Base_ptr)
                 std::
                 prev<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
                           (in_stack_ffffffffffffffa8,0x3414e0);
    }
    local_8 = local_10;
  }
  return (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
          )local_8;
}

Assistant:

IteratorT iterRnd (IteratorT lower, IteratorT upper)
{
    const long dist = (long)std::distance(lower, upper);
    // Does the range (cslUpper excluded!) not contain anything?
    if (dist <= 0)
        return upper;
    // Does the "range" only contain exactly one element? Then shortcut the search
    if (dist == 1)
        return lower;
    // Contains more than one, so make a random choice
    const float rnd = float(std::rand()) / float(RAND_MAX); // should be less than 1.0
    const long adv = long(rnd * dist);                      // therefor, should be less than `dist`
    if (adv < dist)                                         // but let's make sure
        std::advance(lower, long(adv));
    else
        lower = std::prev(upper);
    return lower;
}